

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O1

h__Reader * __thiscall
ASDCP::PCM::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  char cVar1;
  MDDEntry *Ctx_00;
  undefined4 in_register_00000034;
  long lVar2;
  undefined1 *puVar3;
  
  lVar2 = CONCAT44(in_register_00000034,FrameNum);
  cVar1 = (**(code **)(**(long **)(lVar2 + 0x10) + 0x40))();
  if (cVar1 == '\0') {
    puVar3 = Kumu::RESULT_INIT;
  }
  else {
    if ((int)FrameBuf + 1U <= *(uint *)(lVar2 + 0x680)) {
      if (*(Dictionary **)(lVar2 + 8) != (Dictionary *)0x0) {
        Ctx_00 = Dictionary::Type(*(Dictionary **)(lVar2 + 8),MDD_WAVEssence);
        h__ASDCPReader::ReadEKLVFrame
                  (&this->super_h__ASDCPReader,FrameNum,
                   (FrameBuffer *)((ulong)FrameBuf & 0xffffffff),(byte_t *)Ctx,
                   (AESDecContext *)Ctx_00,HMAC);
        return this;
      }
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_PCM.cpp"
                    ,0x15e,
                    "ASDCP::Result_t ASDCP::PCM::MXFReader::h__Reader::ReadFrame(ui32_t, FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    puVar3 = ASDCP::RESULT_RANGE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, FrameBuffer& FrameBuf,
					    AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  if ( (FrameNum+1) > m_ADesc.ContainerDuration )
    {
      return RESULT_RANGE;
    }

  assert(m_Dict);
  return ReadEKLVFrame(FrameNum, FrameBuf, m_Dict->ul(MDD_WAVEssence), Ctx, HMAC);
}